

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

bool filemgr_update_file_linkage(filemgr *file,char *old_filename,char *new_filename)

{
  bool bVar1;
  
  pthread_spin_lock(&file->lock);
  bVar1 = true;
  if (old_filename != (char *)0x0) {
    if (file->old_filename == (char *)0x0) {
      assign_old_filename(file,old_filename);
    }
    else if ((file->ref_count).super___atomic_base<unsigned_int>._M_i == 0) {
      bVar1 = false;
      fdb_assert_die("atomic_get_uint32_t(&file->ref_count)",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                     ,0xa4f,(ulong)(file->ref_count).super___atomic_base<unsigned_int>._M_i,0);
    }
    else {
      bVar1 = false;
    }
  }
  if (new_filename != (char *)0x0) {
    assign_new_filename(file,new_filename);
  }
  pthread_spin_unlock(&file->lock);
  return bVar1;
}

Assistant:

bool filemgr_update_file_linkage(struct filemgr *file,
                                 const char *old_filename,
                                 const char *new_filename)
{

    bool ret = true;
    spin_lock(&file->lock);
    if (old_filename) {
        if (!file->old_filename) {
            assign_old_filename(file, old_filename);
        } else {
            ret = false;
            fdb_assert(atomic_get_uint32_t(&file->ref_count),
                       atomic_get_uint32_t(&file->ref_count), 0);
        }
    }
    if (new_filename) {
        assign_new_filename(file, new_filename);
    }
    spin_unlock(&file->lock);
    return ret;
}